

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall CClient::InitInterfaces(CClient *this)

{
  int iVar1;
  IEngine *pIVar2;
  IEditor *pIVar3;
  IEngineSound *pIVar4;
  IEngineTextRender *pIVar5;
  IGameClient *pIVar6;
  IEngineInput *pIVar7;
  IEngineMap *pIVar8;
  IMapChecker *pIVar9;
  IEngineMasterServer *pIVar10;
  IConfigManager *pIVar11;
  undefined4 extraout_var;
  IStorage *pIVar12;
  IConsole *pIVar13;
  CClient *in_RDI;
  char *unaff_retaddr;
  CNetClient *in_stack_00000008;
  CServerBrowser *in_stack_00000010;
  IKernel *in_stack_ffffffffffffffd0;
  CBlacklist *in_stack_ffffffffffffffe0;
  CDemoRecorder *this_00;
  
  IInterface::Kernel((IInterface *)in_RDI);
  pIVar2 = IKernel::RequestInterface<IEngine>(in_stack_ffffffffffffffd0);
  in_RDI->m_pEngine = pIVar2;
  IInterface::Kernel((IInterface *)in_RDI);
  pIVar3 = IKernel::RequestInterface<IEditor>(in_stack_ffffffffffffffd0);
  in_RDI->m_pEditor = pIVar3;
  IInterface::Kernel((IInterface *)in_RDI);
  pIVar4 = IKernel::RequestInterface<IEngineSound>(in_stack_ffffffffffffffd0);
  in_RDI->m_pSound = pIVar4;
  IInterface::Kernel((IInterface *)in_RDI);
  pIVar5 = IKernel::RequestInterface<IEngineTextRender>(in_stack_ffffffffffffffd0);
  in_RDI->m_pTextRender = pIVar5;
  IInterface::Kernel((IInterface *)in_RDI);
  pIVar6 = IKernel::RequestInterface<IGameClient>(in_stack_ffffffffffffffd0);
  in_RDI->m_pGameClient = pIVar6;
  IInterface::Kernel((IInterface *)in_RDI);
  pIVar7 = IKernel::RequestInterface<IEngineInput>(in_stack_ffffffffffffffd0);
  in_RDI->m_pInput = pIVar7;
  IInterface::Kernel((IInterface *)in_RDI);
  pIVar8 = IKernel::RequestInterface<IEngineMap>(in_stack_ffffffffffffffd0);
  in_RDI->m_pMap = pIVar8;
  IInterface::Kernel((IInterface *)in_RDI);
  pIVar9 = IKernel::RequestInterface<IMapChecker>(in_stack_ffffffffffffffd0);
  in_RDI->m_pMapChecker = pIVar9;
  IInterface::Kernel((IInterface *)in_RDI);
  pIVar10 = IKernel::RequestInterface<IEngineMasterServer>(in_stack_ffffffffffffffd0);
  in_RDI->m_pMasterServer = pIVar10;
  IInterface::Kernel((IInterface *)in_RDI);
  pIVar11 = IKernel::RequestInterface<IConfigManager>(in_stack_ffffffffffffffd0);
  in_RDI->m_pConfigManager = pIVar11;
  iVar1 = (*(in_RDI->m_pConfigManager->super_IInterface)._vptr_IInterface[6])();
  in_RDI->m_pConfig = (CConfig *)CONCAT44(extraout_var,iVar1);
  IInterface::Kernel((IInterface *)in_RDI);
  pIVar12 = IKernel::RequestInterface<IStorage>(in_stack_ffffffffffffffd0);
  in_RDI->m_pStorage = pIVar12;
  (*(in_RDI->m_pGameClient->super_IInterface)._vptr_IInterface[0x13])();
  CServerBrowser::Init(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  CFriends::Init((CFriends *)in_stack_ffffffffffffffe0);
  CBlacklist::Init(in_stack_ffffffffffffffe0);
  this_00 = &in_RDI->m_DemoRecorder;
  pIVar13 = Console(in_RDI);
  CDemoRecorder::Init(this_00,pIVar13,in_RDI->m_pStorage);
  pIVar13 = Console(in_RDI);
  CDemoPlayer::Init(&in_RDI->m_DemoPlayer,pIVar13,in_RDI->m_pStorage);
  return;
}

Assistant:

void CClient::InitInterfaces()
{
	// fetch interfaces
	m_pEngine = Kernel()->RequestInterface<IEngine>();
	m_pEditor = Kernel()->RequestInterface<IEditor>();
	//m_pGraphics = Kernel()->RequestInterface<IEngineGraphics>();
	m_pSound = Kernel()->RequestInterface<IEngineSound>();
	m_pTextRender = Kernel()->RequestInterface<IEngineTextRender>();
	m_pGameClient = Kernel()->RequestInterface<IGameClient>();
	m_pInput = Kernel()->RequestInterface<IEngineInput>();
	m_pMap = Kernel()->RequestInterface<IEngineMap>();
	m_pMapChecker = Kernel()->RequestInterface<IMapChecker>();
	m_pMasterServer = Kernel()->RequestInterface<IEngineMasterServer>();
	m_pConfigManager = Kernel()->RequestInterface<IConfigManager>();
	m_pConfig = m_pConfigManager->Values();
	m_pStorage = Kernel()->RequestInterface<IStorage>();

	//
	m_ServerBrowser.Init(&m_ContactClient, m_pGameClient->NetVersion());
	m_Friends.Init();
	m_Blacklist.Init();
	m_DemoRecorder.Init(Console(), m_pStorage);
	m_DemoPlayer.Init(Console(), m_pStorage);
}